

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::Texture2DArraySpecCase::verifyTexture
          (Texture2DArraySpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  ContextWrapper *this_00;
  TestLog *log;
  deUint32 program;
  bool bVar1;
  Surface *dst;
  bool bVar2;
  bool bVar3;
  DataType samplerType;
  RenderTarget *pRVar4;
  TextureFormat *pTVar5;
  long *plVar6;
  int iVar7;
  TextureFormat TVar8;
  long *plVar9;
  int iVar10;
  ReferenceContext *pRVar11;
  void *pvVar12;
  string desc;
  string name;
  string layerStr;
  string levelStr;
  Surface result;
  Surface reference;
  UVec4 threshold;
  Texture2DArrayShader shader;
  int local_468;
  undefined1 local_450 [16];
  long local_440;
  TextureFormat TStack_438;
  long *local_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  deUint32 local_400;
  deUint32 local_3fc;
  ReferenceContext *local_3f8;
  TextureFormat local_3f0 [2];
  long local_3e0 [2];
  long *local_3d0;
  long local_3c8;
  long local_3c0;
  long lStack_3b8;
  long *local_3b0;
  long local_3a0 [2];
  long *local_390;
  long local_380 [2];
  Surface local_370;
  Surface local_358;
  ContextWrapper *local_340;
  UVec4 local_338;
  undefined1 local_328 [16];
  long local_318;
  TextureFormat TStack_310;
  ios_base local_2b8 [264];
  Texture2DArrayShader local_1b0;
  
  samplerType = glu::getSampler2DArrayType(this->m_texFormat);
  FboTestUtil::Texture2DArrayShader::Texture2DArrayShader(&local_1b0,samplerType,TYPE_FLOAT_VEC4);
  local_3f8 = (ReferenceContext *)gles3Context;
  local_3fc = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,&local_1b0);
  local_400 = (*(refContext->super_Context)._vptr_Context[0x75])(refContext,&local_1b0);
  FboTestUtil::Texture2DArrayShader::setTexScaleBias
            (&local_1b0,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    pRVar11 = refContext;
    if (bVar3) {
      pRVar11 = local_3f8;
    }
    sglr::ContextWrapper::setContext(this_00,&pRVar11->super_Context);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x8072,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x813d,this->m_numLevels + -1);
    bVar2 = false;
  } while (bVar3);
  if (0 < this->m_numLayers) {
    local_468 = 0;
    local_340 = this_00;
    do {
      FboTestUtil::Texture2DArrayShader::setLayer(&local_1b0,local_468);
      if (0 < this->m_numLevels) {
        iVar7 = 0;
        bVar2 = true;
        do {
          iVar10 = this->m_width >> ((byte)iVar7 & 0x1f);
          if (iVar10 < 2) {
            iVar10 = 1;
          }
          local_428 = (long *)CONCAT44(local_428._4_4_,iVar10);
          iVar10 = this->m_height >> ((byte)iVar7 & 0x1f);
          if (iVar10 < 2) {
            iVar10 = 1;
          }
          tcu::Surface::Surface(&local_358);
          tcu::Surface::Surface(&local_370);
          bVar3 = true;
          do {
            bVar1 = bVar3;
            program = local_400;
            dst = &local_358;
            pRVar11 = refContext;
            if (bVar1) {
              program = local_3fc;
              dst = &local_370;
              pRVar11 = local_3f8;
            }
            sglr::ContextWrapper::setContext(local_340,&pRVar11->super_Context);
            FboTestUtil::Texture2DArrayShader::setUniforms
                      (&local_1b0,&pRVar11->super_Context,program);
            TextureSpecCase::renderTex
                      (&this->super_TextureSpecCase,dst,program,(int)local_428,iVar10);
            bVar3 = false;
          } while (bVar1);
          pRVar4 = Context::getRenderTarget((this->super_TextureSpecCase).super_TestCase.m_context);
          computeCompareThreshold((Functional *)&local_338,&pRVar4->m_pixelFormat,this->m_texFormat)
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          std::ostream::operator<<((ostringstream *)local_328,iVar7);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
          std::ios_base::~ios_base(local_2b8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          std::ostream::operator<<((ostringstream *)local_328,local_468);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
          std::ios_base::~ios_base(local_2b8);
          local_420 = &local_410;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Layer","");
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_3b0);
          local_450._0_8_ = &local_440;
          TVar8 = (TextureFormat)(pTVar5 + 2);
          if (*pTVar5 == TVar8) {
            local_440 = *(long *)TVar8;
            TStack_438 = pTVar5[3];
          }
          else {
            local_440 = *(long *)TVar8;
            local_450._0_8_ = *pTVar5;
          }
          local_450._8_8_ = pTVar5[1];
          *pTVar5 = TVar8;
          pTVar5[1].order = R;
          pTVar5[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar5[2].order = R;
          pTVar5 = (TextureFormat *)std::__cxx11::string::append(local_450);
          TVar8 = (TextureFormat)(pTVar5 + 2);
          if (*pTVar5 == TVar8) {
            local_318 = *(long *)TVar8;
            TStack_310 = pTVar5[3];
            local_328._0_8_ = &local_318;
          }
          else {
            local_318 = *(long *)TVar8;
            local_328._0_8_ = *pTVar5;
          }
          local_328._8_8_ = pTVar5[1];
          *pTVar5 = TVar8;
          pTVar5[1].order = R;
          pTVar5[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar5[2].order = R;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_328,(ulong)local_390);
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_3c0 = *plVar9;
            lStack_3b8 = plVar6[3];
            local_3d0 = &local_3c0;
          }
          else {
            local_3c0 = *plVar9;
            local_3d0 = (long *)*plVar6;
          }
          local_3c8 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((long *)local_328._0_8_ != &local_318) {
            operator_delete((void *)local_328._0_8_,local_318 + 1);
          }
          if ((long *)local_450._0_8_ != &local_440) {
            operator_delete((void *)local_450._0_8_,local_440 + 1);
          }
          if (local_420 != &local_410) {
            operator_delete(local_420,local_410 + 1);
          }
          local_3f0[0] = (TextureFormat)local_3e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"Layer ","");
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_3b0);
          local_450._0_8_ = &local_440;
          TVar8 = (TextureFormat)(pTVar5 + 2);
          if (*pTVar5 == TVar8) {
            local_440 = *(long *)TVar8;
            TStack_438 = pTVar5[3];
          }
          else {
            local_440 = *(long *)TVar8;
            local_450._0_8_ = *pTVar5;
          }
          local_450._8_8_ = pTVar5[1];
          *pTVar5 = TVar8;
          pTVar5[1].order = R;
          pTVar5[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar5[2].order = R;
          pTVar5 = (TextureFormat *)std::__cxx11::string::append(local_450);
          TVar8 = (TextureFormat)(pTVar5 + 2);
          if (*pTVar5 == TVar8) {
            local_318 = *(long *)TVar8;
            TStack_310 = pTVar5[3];
            local_328._0_8_ = &local_318;
          }
          else {
            local_318 = *(long *)TVar8;
            local_328._0_8_ = *pTVar5;
          }
          local_328._8_8_ = pTVar5[1];
          *pTVar5 = TVar8;
          pTVar5[1].order = R;
          pTVar5[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar5[2].order = R;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_328,(ulong)local_390);
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_410 = *plVar9;
            lStack_408 = plVar6[3];
            local_420 = &local_410;
          }
          else {
            local_410 = *plVar9;
            local_420 = (long *)*plVar6;
          }
          local_418 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((long *)local_328._0_8_ != &local_318) {
            operator_delete((void *)local_328._0_8_,local_318 + 1);
          }
          if ((long *)local_450._0_8_ != &local_440) {
            operator_delete((void *)local_450._0_8_,local_440 + 1);
          }
          if (local_3f0[0] != (TextureFormat)local_3e0) {
            operator_delete((void *)local_3f0[0],local_3e0[0] + 1);
          }
          plVar6 = local_3d0;
          log = ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
          local_428 = local_420;
          local_450._0_4_ = RGBA;
          local_450._4_4_ = UNORM_INT8;
          pvVar12 = (void *)local_358.m_pixels.m_cap;
          if ((void *)local_358.m_pixels.m_cap != (void *)0x0) {
            pvVar12 = local_358.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_328,(TextureFormat *)local_450,local_358.m_width,
                     local_358.m_height,1,pvVar12);
          local_3f0[0].order = RGBA;
          local_3f0[0].type = UNORM_INT8;
          pvVar12 = (void *)local_370.m_pixels.m_cap;
          if ((void *)local_370.m_pixels.m_cap != (void *)0x0) {
            pvVar12 = local_370.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_450,local_3f0,local_370.m_width,local_370.m_height,1
                     ,pvVar12);
          bVar3 = tcu::intThresholdCompare
                            (log,(char *)plVar6,(char *)local_428,
                             (ConstPixelBufferAccess *)local_328,(ConstPixelBufferAccess *)local_450
                             ,&local_338,(iVar7 != 0 || local_468 != 0) + COMPARE_LOG_RESULT);
          if (!bVar3) {
            tcu::TestContext::setTestResult
                      ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
            bVar2 = false;
          }
          if (local_420 != &local_410) {
            operator_delete(local_420,local_410 + 1);
          }
          if (local_3d0 != &local_3c0) {
            operator_delete(local_3d0,local_3c0 + 1);
          }
          if (local_3b0 != local_3a0) {
            operator_delete(local_3b0,local_3a0[0] + 1);
          }
          if (local_390 != local_380) {
            operator_delete(local_390,local_380[0] + 1);
          }
          tcu::Surface::~Surface(&local_370);
          tcu::Surface::~Surface(&local_358);
          iVar7 = iVar7 + 1;
        } while (bVar3 && iVar7 < this->m_numLevels);
        if (!bVar2) break;
      }
      local_468 = local_468 + 1;
    } while (local_468 < this->m_numLayers);
  }
  sglr::ShaderProgram::~ShaderProgram(&local_1b0.super_ShaderProgram);
  return;
}

Assistant:

void Texture2DArraySpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture2DArrayShader	shader			(glu::getSampler2DArrayType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32				shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32				shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
	{
		bool layerOk = true;

		shader.setLayer(layerNdx);

		for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
		{
			int				levelW		= de::max(1, m_width	>> levelNdx);
			int				levelH		= de::max(1, m_height	>> levelNdx);
			tcu::Surface	reference;
			tcu::Surface	result;

			for (int ndx = 0; ndx < 2; ndx++)
			{
				tcu::Surface&	dst			= ndx ? reference									: result;
				sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
				deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

				setContext(ctx);
				shader.setUniforms(*ctx, shaderID);
				renderTex(dst, shaderID, levelW, levelH);
			}

			UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			string			levelStr	= de::toString(levelNdx);
			string			layerStr	= de::toString(layerNdx);
			string			name		= string("Layer") + layerStr + "Level" + levelStr;
			string			desc		= string("Layer ") + layerStr + ", Level " + levelStr;
			bool			depthOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
																   (levelNdx == 0 && layerNdx == 0) ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!depthOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				layerOk = false;
				break;
			}
		}

		if (!layerOk)
			break;
	}
}